

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void randomize_buffer(u32 *seed,u8 *buffer,u32 size)

{
  undefined1 uVar1;
  u32 uVar2;
  u32 x_1;
  u32 x;
  u32 size_local;
  u8 *buffer_local;
  u32 *seed_local;
  
  _x = (u32 *)buffer;
  for (x_1 = size; 3 < x_1; x_1 = x_1 - 4) {
    uVar2 = random_u32(seed);
    *_x = uVar2;
    _x = _x + 1;
  }
  if (x_1 != 0) {
    uVar2 = random_u32(seed);
    uVar1 = (undefined1)uVar2;
    if (x_1 == 1) {
      *(undefined1 *)_x = uVar1;
    }
    else if (x_1 == 2) {
      *(undefined1 *)_x = uVar1;
    }
    else if (x_1 == 3) {
      *(undefined1 *)_x = uVar1;
    }
  }
  return;
}

Assistant:

static void randomize_buffer(u32* seed, u8* buffer, u32 size) {
  while (size >= sizeof(u32)) {
    u32 x = random_u32(seed);
    memcpy(buffer, &x, sizeof(x));
    buffer += sizeof(u32);
    size -= sizeof(u32);
  }
  if (size > 0) {
    u32 x = random_u32(seed);
    switch (size) {
      case 3: *buffer++ = x & 0xff; x >>= 8; break;
      case 2: *buffer++ = x & 0xff; x >>= 8; break;
      case 1: *buffer++ = x & 0xff; x >>= 8; break;
    }
  }
}